

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

RK_S32 mpp_av1_read_unsigned
                 (BitReadCtx_t *gbc,RK_S32 width,char *name,RK_U32 *write_to,RK_U32 range_min,
                 RK_U32 range_max)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  undefined8 in_RAX;
  RK_U32 _out;
  
  _out = (RK_U32)((ulong)in_RAX >> 0x20);
  if (0x1f < width - 1U) {
    _mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,"width > 0 && width <= 32",
               "mpp_av1_read_unsigned",0xb0);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  RVar1 = mpp_get_bits_left(gbc);
  if (RVar1 < width) {
    _mpp_log_l(2,"av1d_cbs","Invalid value at %s: bitstream ended.\n","mpp_av1_read_unsigned",name);
    RVar1 = -1;
  }
  else {
    MVar2 = mpp_read_longbits(gbc,width,&_out);
    gbc->ret = MVar2;
    RVar1 = -1;
    if (MVar2 == MPP_OK) {
      if (_out < range_min || range_max < _out) {
        _mpp_log_l(2,"av1d_cbs","%s out of range: %d, but must be in [%d,%d].\n",
                   "mpp_av1_read_unsigned",name,(ulong)_out,(ulong)range_min,(ulong)range_max);
      }
      else {
        *write_to = _out;
        RVar1 = 0;
      }
    }
  }
  return RVar1;
}

Assistant:

RK_S32 mpp_av1_read_unsigned(BitReadCtx_t *gbc,
                             RK_S32 width, const char *name,
                             RK_U32 *write_to, RK_U32 range_min,
                             RK_U32 range_max)
{
    RK_U32 value;

    mpp_assert(width > 0 && width <= 32);

    if (mpp_get_bits_left(gbc) < width) {
        mpp_err_f("Invalid value at "
                  "%s: bitstream ended.\n", name);
        return MPP_NOK;
    }

    READ_BITS_LONG(gbc, width, &value);

    if (value < range_min || value > range_max) {
        mpp_err_f("%s out of range: "
                  "%d, but must be in [%d,%d].\n",
                  name, value, range_min, range_max);
        return MPP_NOK;
    }

    *write_to = value;
    return 0;

__bitread_error:
    return MPP_NOK;

}